

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGTryUnlink(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,
                   xmlRelaxNGDefinePtr_conflict parent,xmlRelaxNGDefinePtr_conflict prev)

{
  xmlRelaxNGDefinePtr_conflict local_28;
  xmlRelaxNGDefinePtr_conflict prev_local;
  xmlRelaxNGDefinePtr_conflict parent_local;
  xmlRelaxNGDefinePtr_conflict cur_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  local_28 = prev;
  if (prev == (xmlRelaxNGDefinePtr_conflict)0x0) {
    if (parent == (xmlRelaxNGDefinePtr_conflict)0x0) {
      cur->type = XML_RELAXNG_NOOP;
      local_28 = cur;
    }
    else if (parent->content == cur) {
      parent->content = cur->next;
    }
    else if (parent->attrs == cur) {
      parent->attrs = cur->next;
    }
    else if (parent->nameClass == cur) {
      parent->nameClass = cur->next;
    }
  }
  else {
    prev->next = cur->next;
  }
  return local_28;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGTryUnlink(xmlRelaxNGParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                    xmlRelaxNGDefinePtr cur,
                    xmlRelaxNGDefinePtr parent, xmlRelaxNGDefinePtr prev)
{
    if (prev != NULL) {
        prev->next = cur->next;
    } else {
        if (parent != NULL) {
            if (parent->content == cur)
                parent->content = cur->next;
            else if (parent->attrs == cur)
                parent->attrs = cur->next;
            else if (parent->nameClass == cur)
                parent->nameClass = cur->next;
        } else {
            cur->type = XML_RELAXNG_NOOP;
            prev = cur;
        }
    }
    return (prev);
}